

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::on_dht_request(session_impl *this)

{
  msg *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  entry *in_R8;
  string_view query;
  
  query._M_str = in_RDX;
  query._M_len = in_RSI;
  on_dht_request((session_impl *)&this[-1].m_deferred_submit_disk_jobs,query,in_RCX,in_R8);
  return;
}

Assistant:

bool session_impl::on_dht_request(string_view query
		, dht::msg const& request, entry& response)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_dht_request_idx])
		{
			if (ext->on_dht_request(query
				, request.addr, request.message, response))
				return true;
		}
#else
		TORRENT_UNUSED(query);
		TORRENT_UNUSED(request);
		TORRENT_UNUSED(response);
#endif
		return false;
	}